

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

float_t __thiscall djb::microfacet::g1(microfacet *this,vec3 *wm,vec3 *wi,args *args)

{
  float fVar1;
  float_t fVar2;
  float fVar3;
  
  fVar2 = 0.0;
  if (0.0 < wm->z) {
    fVar1 = 0.0;
    if (0.0 <= wi->z) {
      fVar1 = wi->z;
    }
    fVar3 = 1.0;
    if (fVar1 <= 1.0) {
      fVar3 = fVar1;
    }
    fVar2 = sigma(this,wi,args);
    fVar2 = fVar3 / fVar2;
  }
  return fVar2;
}

Assistant:

float_t
microfacet::g1(const vec3 &wm, const vec3 &wi, const args &args) const
{
	if (wm.z > 0)
		return sat(wi.z) / sigma(wi, args);
	return 0;
}